

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common-test.c++
# Opt level: O0

void __thiscall kj::parse::anon_unknown_0::TestCase362::run(TestCase362 *this)

{
  char **ppcVar1;
  size_t *psVar2;
  bool bVar3;
  Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:365:17)>
  TVar4;
  Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:367:17)>
  TVar5;
  char *pcVar6;
  char *pcVar7;
  Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:365:17)>
  *parsers;
  bool local_139;
  undefined1 local_138 [7];
  bool _kj_shouldLog_3;
  bool local_119;
  StringPtr *pSStack_118;
  bool _kj_shouldLog_2;
  StringPtr *s_1;
  Maybe<kj::StringPtr> result_1;
  Input input_1;
  StringPtr text_1;
  undefined1 local_c0 [7];
  bool _kj_shouldLog_1;
  bool local_a1;
  StringPtr *pSStack_a0;
  bool _kj_shouldLog;
  StringPtr *s;
  undefined1 local_88 [8];
  Maybe<kj::StringPtr> result;
  Input input;
  StringPtr text;
  char local_38;
  Exactly_<char> local_37;
  char local_36;
  Exactly_<char> local_35;
  Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>
  local_34;
  Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>
  local_30;
  undefined1 local_2c;
  Type local_2b;
  char local_2a;
  Exactly_<char> local_29;
  char local_28;
  Exactly_<char> local_27;
  char local_26;
  Exactly_<char> local_25;
  Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>
  local_24;
  undefined1 local_20 [13];
  OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:365:17)>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:367:17)>_>
  parser;
  TestCase362 *this_local;
  
  local_26 = 'f';
  parser._3_8_ = this;
  local_25 = exactly<char>(&local_26);
  local_28 = 'o';
  local_27 = exactly<char>(&local_28);
  local_2a = 'o';
  local_29 = exactly<char>(&local_2a);
  local_24 = sequence<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>
                       (&local_25,&local_27,&local_29);
  TVar4 = transform<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::__0>
                    (&local_24,&local_2b);
  local_20._0_4_ = TVar4.subParser;
  local_20[4] = TVar4._4_1_;
  local_36 = 'b';
  local_35 = exactly<char>(&local_36);
  local_38 = 'a';
  local_37 = exactly<char>(&local_38);
  text.content.size_._6_1_ = 0x72;
  text.content.size_._7_1_ = exactly<char>((char *)((long)&text.content.size_ + 6));
  local_34 = sequence<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>
                       (&local_35,&local_37,(Exactly_<char> *)((long)&text.content.size_ + 7));
  TVar5 = transform<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::__1>
                    (&local_34,(Type *)((long)&text.content.size_ + 5));
  local_30 = TVar5.subParser;
  local_2c = TVar5._4_1_;
  local_20._5_8_ =
       oneOf<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::__0>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::__1>>
                 ((OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:365:17)>,_kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:367:17)>_>
                   *)local_20,(parse *)&local_30,parsers,
                  (Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>,_kj::parse::Exactly_<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_parse_common_test_c__:367:17)>
                   *)(ulong)(uint)local_30);
  ppcVar1 = &input.best;
  StringPtr::StringPtr((StringPtr *)ppcVar1,"foo");
  pcVar6 = StringPtr::begin((StringPtr *)ppcVar1);
  pcVar7 = StringPtr::end((StringPtr *)ppcVar1);
  psVar2 = &result.ptr.field_1.value.content.size_;
  IteratorInput<char,_const_char_*>::IteratorInput
            ((IteratorInput<char,_const_char_*> *)psVar2,pcVar6,pcVar7);
  OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::$_0>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::$_1>>
  ::operator()((Maybe<kj::StringPtr> *)local_88,
               (OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::__0>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::__1>>
                *)(local_20 + 5),(IteratorInput<char,_const_char_*> *)psVar2);
  pSStack_a0 = kj::_::readMaybe<kj::StringPtr>((Maybe<kj::StringPtr> *)local_88);
  if (pSStack_a0 == (StringPtr *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)local_c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x178);
    AddFailureAdapter::operator<<
              ((AddFailureAdapter *)local_c0,(char (*) [26])"Expected \'foo\', got null.");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)local_c0);
  }
  else {
    bVar3 = kj::operator==("foo",pSStack_a0);
    if (!bVar3) {
      local_a1 = kj::_::Debug::shouldLog(ERROR);
      while (local_a1 != false) {
        kj::_::Debug::log<char_const(&)[33],char_const(&)[4],kj::StringPtr&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                   ,0x176,ERROR,"\"failed: expected \" \"(\\\"foo\\\") == (*s)\", \"foo\", *s",
                   (char (*) [33])"failed: expected (\"foo\") == (*s)",(char (*) [4])0x654402,
                   pSStack_a0);
        local_a1 = false;
      }
    }
  }
  bVar3 = IteratorInput<char,_const_char_*>::atEnd
                    ((IteratorInput<char,_const_char_*> *)&result.ptr.field_1.value.content.size_);
  if (!bVar3) {
    text_1.content.size_._7_1_ = kj::_::Debug::shouldLog(ERROR);
    while (text_1.content.size_._7_1_ != false) {
      kj::_::Debug::log<char_const(&)[31]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x17a,ERROR,"\"failed: expected \" \"input.atEnd()\"",
                 (char (*) [31])"failed: expected input.atEnd()");
      text_1.content.size_._7_1_ = false;
    }
  }
  Maybe<kj::StringPtr>::~Maybe((Maybe<kj::StringPtr> *)local_88);
  IteratorInput<char,_const_char_*>::~IteratorInput
            ((IteratorInput<char,_const_char_*> *)&result.ptr.field_1.value.content.size_);
  ppcVar1 = &input_1.best;
  StringPtr::StringPtr((StringPtr *)ppcVar1,"bar");
  pcVar6 = StringPtr::begin((StringPtr *)ppcVar1);
  pcVar7 = StringPtr::end((StringPtr *)ppcVar1);
  psVar2 = &result_1.ptr.field_1.value.content.size_;
  IteratorInput<char,_const_char_*>::IteratorInput
            ((IteratorInput<char,_const_char_*> *)psVar2,pcVar6,pcVar7);
  OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::$_0>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::$_1>>
  ::operator()((Maybe<kj::StringPtr> *)&s_1,
               (OneOf_<kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::__0>,kj::parse::Transform_<kj::parse::Sequence_<kj::parse::Exactly_<char>,kj::parse::Exactly_<char>,kj::parse::Exactly_<char>>,kj::parse::(anonymous_namespace)::TestCase362::run()::__1>>
                *)(local_20 + 5),(IteratorInput<char,_const_char_*> *)psVar2);
  pSStack_118 = kj::_::readMaybe<kj::StringPtr>((Maybe<kj::StringPtr> *)&s_1);
  if (pSStack_118 == (StringPtr *)0x0) {
    AddFailureAdapter::AddFailureAdapter
              ((AddFailureAdapter *)local_138,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
               ,0x184);
    AddFailureAdapter::operator<<
              ((AddFailureAdapter *)local_138,(char (*) [26])"Expected \'bar\', got null.");
    AddFailureAdapter::~AddFailureAdapter((AddFailureAdapter *)local_138);
  }
  else {
    bVar3 = kj::operator==("bar",pSStack_118);
    if (!bVar3) {
      local_119 = kj::_::Debug::shouldLog(ERROR);
      while (local_119 != false) {
        kj::_::Debug::log<char_const(&)[33],char_const(&)[4],kj::StringPtr&>
                  ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                   ,0x182,ERROR,"\"failed: expected \" \"(\\\"bar\\\") == (*s)\", \"bar\", *s",
                   (char (*) [33])"failed: expected (\"bar\") == (*s)",(char (*) [4])0x635ef5,
                   pSStack_118);
        local_119 = false;
      }
    }
  }
  bVar3 = IteratorInput<char,_const_char_*>::atEnd
                    ((IteratorInput<char,_const_char_*> *)&result_1.ptr.field_1.value.content.size_)
  ;
  if (!bVar3) {
    local_139 = kj::_::Debug::shouldLog(ERROR);
    while (local_139 != false) {
      kj::_::Debug::log<char_const(&)[31]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/parse/common-test.c++"
                 ,0x186,ERROR,"\"failed: expected \" \"input.atEnd()\"",
                 (char (*) [31])"failed: expected input.atEnd()");
      local_139 = false;
    }
  }
  Maybe<kj::StringPtr>::~Maybe((Maybe<kj::StringPtr> *)&s_1);
  IteratorInput<char,_const_char_*>::~IteratorInput
            ((IteratorInput<char,_const_char_*> *)&result_1.ptr.field_1.value.content.size_);
  return;
}

Assistant:

TEST(CommonParsers, OneOfParser) {
  auto parser = oneOf(
      transform(sequence(exactly('f'), exactly('o'), exactly('o')),
                []() -> StringPtr { return "foo"; }),
      transform(sequence(exactly('b'), exactly('a'), exactly('r')),
                []() -> StringPtr { return "bar"; }));

  {
    StringPtr text = "foo";
    Input input(text.begin(), text.end());
    Maybe<StringPtr> result = parser(input);
    KJ_IF_MAYBE(s, result) {
      EXPECT_EQ("foo", *s);
    } else {
      ADD_FAILURE() << "Expected 'foo', got null.";
    }
    EXPECT_TRUE(input.atEnd());
  }